

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET flush_direct_output(H264dVideoCtx_t *p_Vid)

{
  MPP_RET MVar1;
  
  MVar1 = write_unpaired_field(p_Vid,&p_Vid->out_buffer);
  if (MVar1 < MPP_OK) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x3e2);
    }
  }
  else {
    free_storable_picture(p_Vid->p_Dec,(p_Vid->out_buffer).frame);
    MVar1 = MPP_OK;
    (p_Vid->out_buffer).frame = (h264_store_pic_t *)0x0;
    free_storable_picture(p_Vid->p_Dec,(p_Vid->out_buffer).top_field);
    (p_Vid->out_buffer).top_field = (h264_store_pic_t *)0x0;
    free_storable_picture(p_Vid->p_Dec,(p_Vid->out_buffer).bottom_field);
    (p_Vid->out_buffer).bottom_field = (h264_store_pic_t *)0x0;
    (p_Vid->out_buffer).is_used = 0;
  }
  return MVar1;
}

Assistant:

static MPP_RET flush_direct_output(H264dVideoCtx_t *p_Vid)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    FUN_CHECK(ret = write_unpaired_field(p_Vid, &p_Vid->out_buffer));
    free_storable_picture(p_Vid->p_Dec, p_Vid->out_buffer.frame);
    p_Vid->out_buffer.frame = NULL;
    free_storable_picture(p_Vid->p_Dec, p_Vid->out_buffer.top_field);
    p_Vid->out_buffer.top_field = NULL;
    free_storable_picture(p_Vid->p_Dec, p_Vid->out_buffer.bottom_field);
    p_Vid->out_buffer.bottom_field = NULL;
    p_Vid->out_buffer.is_used = 0;

    return ret = MPP_OK;
__FAILED:
    return ret;
}